

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_ConstAcc.h
# Opt level: O2

void __thiscall chrono::ChFunction_ConstAcc::Set_av(ChFunction_ConstAcc *this,double m_av)

{
  undefined1 auVar1 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar2 [64];
  
  auVar2._8_56_ = in_register_00001208;
  auVar2._0_8_ = m_av;
  auVar1 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar2._0_16_);
  auVar1 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar1);
  this->av = auVar1._0_8_;
  if (this->aw < auVar1._0_8_) {
    this->av = this->aw;
  }
  return;
}

Assistant:

void Set_av(double m_av) {
        if (m_av < 0)
            m_av = 0;
        if (m_av > 1)
            m_av = 1;
        av = m_av;
        if (av > aw)
            av = aw;
    }